

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_defs.h
# Opt level: O0

uint __thiscall crnd::crn_packed_uint::operator_cast_to_unsigned_int(crn_packed_uint *this)

{
  crn_packed_uint<4U> *this_local;
  
  return (uint)(byte)*this << 0x18 | (uint)(byte)this[1] << 0x10 | (uint)(byte)this[2] << 8 |
         (uint)(byte)this[3];
}

Assistant:

inline operator unsigned int() const
        {
            switch (N)
            {
            case 1:
                return m_buf[0];
            case 2:
                return (m_buf[0] << 8U) | m_buf[1];
            case 3:
                return (m_buf[0] << 16U) | (m_buf[1] << 8U) | (m_buf[2]);
            default:
                return (m_buf[0] << 24U) | (m_buf[1] << 16U) | (m_buf[2] << 8U) | (m_buf[3]);
            }
        }